

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O1

cbtVector3 ThreePlaneIntersection(cbtPlane *p0,cbtPlane *p1,cbtPlane *p2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  undefined1 auVar19 [16];
  cbtVector3 cVar20;
  
  fVar1 = (p0->normal).m_floats[0];
  fVar2 = (p0->normal).m_floats[1];
  fVar3 = (p0->normal).m_floats[2];
  fVar18 = (p1->normal).m_floats[0];
  fVar4 = (p1->normal).m_floats[1];
  fVar5 = (p1->normal).m_floats[2];
  fVar6 = (p2->normal).m_floats[0];
  fVar7 = (p2->normal).m_floats[1];
  fVar8 = (p2->normal).m_floats[2];
  auVar10 = vfmsub231ss_fma(ZEXT416((uint)(fVar7 * fVar5)),ZEXT416((uint)fVar4),ZEXT416((uint)fVar8)
                           );
  auVar19 = vfmsub231ss_fma(ZEXT416((uint)(fVar8 * fVar18)),ZEXT416((uint)fVar5),
                            ZEXT416((uint)fVar6));
  auVar11 = vfmsub231ss_fma(ZEXT416((uint)(fVar6 * fVar4)),ZEXT416((uint)fVar18),
                            ZEXT416((uint)fVar7));
  auVar12 = vfmsub231ss_fma(ZEXT416((uint)(fVar8 * fVar2)),ZEXT416((uint)fVar7),ZEXT416((uint)fVar3)
                           );
  auVar13 = vfmsub231ss_fma(ZEXT416((uint)(fVar3 * fVar6)),ZEXT416((uint)fVar1),ZEXT416((uint)fVar8)
                           );
  auVar14 = vfmsub231ss_fma(ZEXT416((uint)(fVar1 * fVar7)),ZEXT416((uint)fVar2),ZEXT416((uint)fVar6)
                           );
  auVar15 = vfmsub231ss_fma(ZEXT416((uint)(fVar4 * fVar3)),ZEXT416((uint)fVar2),ZEXT416((uint)fVar5)
                           );
  auVar16 = vfmsub231ss_fma(ZEXT416((uint)(fVar5 * fVar1)),ZEXT416((uint)fVar3),
                            ZEXT416((uint)fVar18));
  auVar17 = vfmsub231ss_fma(ZEXT416((uint)(fVar18 * fVar2)),ZEXT416((uint)fVar1),
                            ZEXT416((uint)fVar4));
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(auVar19._0_4_ * fVar2)),auVar10,ZEXT416((uint)fVar1));
  auVar9 = vfmadd231ss_fma(auVar9,auVar11,ZEXT416((uint)fVar3));
  fVar18 = -1.0 / auVar9._0_4_;
  fVar1 = p0->dist;
  fVar2 = p1->dist;
  fVar3 = p2->dist;
  auVar9 = vinsertps_avx(ZEXT416((uint)((auVar15._0_4_ * fVar3 +
                                        fVar2 * auVar12._0_4_ + auVar10._0_4_ * fVar1) * fVar18)),
                         ZEXT416((uint)((auVar16._0_4_ * fVar3 +
                                        auVar13._0_4_ * fVar2 + auVar19._0_4_ * fVar1) * fVar18)),
                         0x10);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = SUB648(ZEXT6064((undefined1  [60])0x0),4);
  auVar19._4_12_ = SUB1612(auVar10 << 0x40,4);
  auVar19._0_4_ = (auVar17._0_4_ * fVar3 + auVar11._0_4_ * fVar1 + fVar2 * auVar14._0_4_) * fVar18;
  cVar20.m_floats._0_8_ = auVar9._0_8_;
  cVar20.m_floats._8_8_ = auVar19._0_8_;
  return (cbtVector3)cVar20.m_floats;
}

Assistant:

cbtVector3 ThreePlaneIntersection(const cbtPlane &p0, const cbtPlane &p1, const cbtPlane &p2)
{
	cbtVector3 N1 = p0.normal;
	cbtVector3 N2 = p1.normal;
	cbtVector3 N3 = p2.normal;

	cbtVector3 n2n3;
	n2n3 = N2.cross(N3);
	cbtVector3 n3n1;
	n3n1 = N3.cross(N1);
	cbtVector3 n1n2;
	n1n2 = N1.cross(N2);

	cbtScalar quotient = (N1.dot(n2n3));

	cbtAssert(cbtFabs(quotient) > cbtScalar(0.000001));

	quotient = cbtScalar(-1.) / quotient;
	n2n3 *= p0.dist;
	n3n1 *= p1.dist;
	n1n2 *= p2.dist;
	cbtVector3 potentialVertex = n2n3;
	potentialVertex += n3n1;
	potentialVertex += n1n2;
	potentialVertex *= quotient;

	cbtVector3 result(potentialVertex.getX(), potentialVertex.getY(), potentialVertex.getZ());
	return result;
}